

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

XMLNode __thiscall XMLParser::XMLNode::deepCopy(XMLNode *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  XMLNodeData *pXVar3;
  undefined8 uVar4;
  char *pcVar5;
  XMLAttribute *pXVar6;
  int *__dest;
  char **ppcVar7;
  XMLClear *pXVar8;
  XMLNode *pXVar9;
  int iVar10;
  long lVar11;
  long *in_RSI;
  long lVar12;
  size_t sVar13;
  long lVar14;
  XMLNode XStack_38;
  
  if ((undefined8 *)*in_RSI == (undefined8 *)0x0) {
    XMLNode(this,(XMLNode *)&emptyXMLNode);
  }
  else {
    pcVar5 = stringDup(*(char **)*in_RSI,-1);
    XMLNode(this,(XMLNodeData *)0x0,pcVar5,*(char *)(*in_RSI + 0x18));
    pXVar3 = this->d;
    lVar14 = *in_RSI;
    lVar11 = (long)*(int *)(lVar14 + 0x14);
    if (lVar11 != 0) {
      pXVar3->nAttribute = *(int *)(lVar14 + 0x14);
      sVar13 = lVar11 << 4;
      pXVar6 = (XMLAttribute *)malloc(sVar13);
      pXVar3->pAttribute = pXVar6;
      do {
        pcVar5 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + -0x10 + sVar13),-1);
        *(char **)((long)&pXVar3->pAttribute[-1].lpszName + sVar13) = pcVar5;
        pcVar5 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + -8 + sVar13),-1);
        *(char **)((long)pXVar3->pAttribute + (sVar13 - 8)) = pcVar5;
        sVar13 = sVar13 - 0x10;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar14 = *in_RSI;
    }
    if (*(long *)(lVar14 + 0x48) == 0) {
      iVar10 = *(int *)(lVar14 + 0xc);
    }
    else {
      iVar10 = *(int *)(lVar14 + 0xc);
      sVar13 = (size_t)((*(int *)(lVar14 + 8) + iVar10 + *(int *)(lVar14 + 0x10)) * 4);
      __dest = (int *)malloc(sVar13);
      pXVar3->pOrder = __dest;
      memcpy(__dest,*(void **)(lVar14 + 0x48),sVar13);
    }
    if (iVar10 != 0) {
      pXVar3->nText = iVar10;
      lVar14 = (long)iVar10;
      ppcVar7 = (char **)malloc(lVar14 * 8);
      pXVar3->pText = ppcVar7;
      do {
        pcVar5 = stringDup(*(char **)(*(long *)(*in_RSI + 0x30) + -8 + lVar14 * 8),-1);
        pXVar3->pText[lVar14 + -1] = pcVar5;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      lVar14 = *in_RSI;
    }
    lVar11 = (long)*(int *)(lVar14 + 0x10);
    if (lVar11 != 0) {
      pXVar3->nClear = *(int *)(lVar14 + 0x10);
      sVar13 = lVar11 * 0x18;
      pXVar8 = (XMLClear *)malloc(sVar13);
      pXVar3->pClear = pXVar8;
      do {
        lVar14 = *(long *)(*in_RSI + 0x38);
        puVar1 = (undefined8 *)(lVar14 + -0x10 + sVar13);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pXVar8 + (sVar13 - 0x10));
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        pcVar5 = stringDup(*(char **)(lVar14 + -0x18 + sVar13),-1);
        pXVar8 = pXVar3->pClear;
        *(char **)((long)&pXVar8[-1].lpszValue + sVar13) = pcVar5;
        sVar13 = sVar13 - 0x18;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar14 = *in_RSI;
    }
    lVar11 = (long)*(int *)(lVar14 + 8);
    if (lVar11 != 0) {
      pXVar3->nChild = *(int *)(lVar14 + 8);
      pXVar9 = (XMLNode *)malloc(lVar11 * 8);
      pXVar3->pChild = pXVar9;
      lVar12 = -lVar11;
      lVar14 = lVar11 * 8;
      do {
        *(undefined8 *)((long)&pXVar9[-1].d + lVar14) = 0;
        deepCopy(&XStack_38);
        operator=((XMLNode *)((long)&pXVar3->pChild[-1].d + lVar14),&XStack_38);
        ~XMLNode(&XStack_38);
        pXVar9 = pXVar3->pChild;
        *(XMLNodeData **)(*(long *)((long)&pXVar9[-1].d + lVar14) + 0x20) = pXVar3;
        lVar12 = lVar12 + 1;
        lVar14 = lVar14 + -8;
      } while (lVar12 != 0);
    }
  }
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::deepCopy() const
    {
        if(!d)
            return XMLNode::emptyXMLNode;
        XMLNode x(NULL, stringDup(d->lpszName), d->isDeclaration);
        XMLNodeData * p = x.d;
        int n = d->nAttribute;
        if(n)
        {
            p->nAttribute = n;
            p->pAttribute = (XMLAttribute *)malloc(n * sizeof(XMLAttribute));
            while(n--)
            {
                p->pAttribute[n].lpszName = stringDup(d->pAttribute[n].lpszName);
                p->pAttribute[n].lpszValue = stringDup(d->pAttribute[n].lpszValue);
            }
        }
        if(d->pOrder)
        {
            n = (d->nChild + d->nText + d->nClear) * sizeof(int);
            p->pOrder = (int *)malloc(n);
            memcpy(p->pOrder, d->pOrder, n);
        }
        n = d->nText;
        if(n)
        {
            p->nText = n;
            p->pText = (XMLCSTR *)malloc(n * sizeof(XMLCSTR));
            while(n--)
                p->pText[n] = stringDup(d->pText[n]);
        }
        n = d->nClear;
        if(n)
        {
            p->nClear = n;
            p->pClear = (XMLClear *)malloc(n * sizeof(XMLClear));
            while(n--)
            {
                p->pClear[n].lpszCloseTag = d->pClear[n].lpszCloseTag;
                p->pClear[n].lpszOpenTag = d->pClear[n].lpszOpenTag;
                p->pClear[n].lpszValue = stringDup(d->pClear[n].lpszValue);
            }
        }
        n = d->nChild;
        if(n)
        {
            p->nChild = n;
            p->pChild = (XMLNode *)malloc(n * sizeof(XMLNode));
            while(n--)
            {
                p->pChild[n].d = NULL;
                p->pChild[n] = d->pChild[n].deepCopy();
                p->pChild[n].d->pParent = p;
            }
        }
        return x;
    }